

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_LoadFactor_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_LoadFactor_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  pointer piVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int i;
  float grow;
  float fVar5;
  size_t bucket_count;
  float shrink_threshold;
  long *local_110;
  int local_108;
  float local_104;
  long *local_100;
  int local_f8;
  AssertHelper local_f0;
  pair<google::BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  local_e8;
  float local_bc;
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_b8;
  
  local_104 = 0.2;
  do {
    local_100 = (long *)0x0;
    local_f8 = 0;
    local_110 = (long *)0x0;
    local_108 = 0;
    local_e8.first.super_iterator.ht._0_4_ = 0;
    local_e8.first.super_iterator.pos = (pointer)0x0;
    google::
    HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashtable
              (&local_b8,0,(hasher *)&local_100,(key_equal *)&local_110,(allocator_type *)&local_e8)
    ;
    iVar2 = UniqueObjectHelper<int>(1);
    google::
    dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::squash_deleted(&local_b8.
                      super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      .ht_);
    local_b8.
    super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.key_info.delkey = -iVar2;
    local_b8.
    super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_deleted_ = true;
    local_b8.
    super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_ =
         local_104 * 0.5;
    local_b8.
    super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_factor_ =
         local_104;
    fVar5 = local_104 *
            (float)local_b8.
                   super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.num_buckets;
    local_b8.
    super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_threshold_ =
         (size_type)fVar5;
    local_b8.
    super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_threshold_ =
         (long)(fVar5 - 9.223372e+18) &
         (long)local_b8.
               super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
               enlarge_threshold_ >> 0x3f |
         local_b8.
         super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_threshold_
    ;
    if (0.0 <= local_b8.
               super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
               shrink_factor_) {
      local_b8.
      super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_ = 0.0;
    }
    fVar5 = local_b8.
            super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_
            * (float)local_b8.
                     super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     .ht_.num_buckets;
    local_b8.
    super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_threshold_ =
         (size_type)fVar5;
    local_b8.
    super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_threshold_ =
         (long)(fVar5 - 9.223372e+18) &
         (long)local_b8.
               super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
               shrink_threshold_ >> 0x3f |
         local_b8.
         super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_threshold_;
    local_b8.
    super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.consider_shrink_ =
         false;
    local_100 = (long *)CONCAT44(local_100._4_4_,local_104);
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_e8,"grow_threshold","ht.max_load_factor()",&local_104,
               (float *)&local_100);
    if ((char)local_e8.first.super_iterator.ht == '\0') {
      testing::Message::Message((Message *)&local_100);
      pcVar4 = "";
      if (local_e8.first.super_iterator.pos != (pointer)0x0) {
        pcVar4 = *(char **)local_e8.first.super_iterator.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x269,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
      if (local_100 != (long *)0x0) {
        (**(code **)(*local_100 + 8))();
      }
    }
    piVar1 = local_e8.first.super_iterator.pos;
    if (local_e8.first.super_iterator.pos != (pointer)0x0) {
      if (*(pointer *)local_e8.first.super_iterator.pos != local_e8.first.super_iterator.pos + 4) {
        operator_delete(*(pointer *)local_e8.first.super_iterator.pos);
      }
      operator_delete(piVar1);
    }
    local_100 = (long *)0x0;
    local_110 = (long *)CONCAT44(local_110._4_4_,
                                 local_b8.
                                 super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                 .ht_.settings.
                                 super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                                 shrink_factor_);
    testing::internal::CmpHelperEQ<double,float>
              ((internal *)&local_e8,"0.0","ht.min_load_factor()",(double *)&local_100,
               (float *)&local_110);
    if ((char)local_e8.first.super_iterator.ht == '\0') {
      testing::Message::Message((Message *)&local_100);
      pcVar4 = "";
      if (local_e8.first.super_iterator.pos != (pointer)0x0) {
        pcVar4 = *(char **)local_e8.first.super_iterator.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x26a,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
      if (local_100 != (long *)0x0) {
        (**(code **)(*local_100 + 8))();
      }
    }
    piVar1 = local_e8.first.super_iterator.pos;
    if (local_e8.first.super_iterator.pos != (pointer)0x0) {
      if (*(pointer *)local_e8.first.super_iterator.pos != local_e8.first.super_iterator.pos + 4) {
        operator_delete(*(pointer *)local_e8.first.super_iterator.pos);
      }
      operator_delete(piVar1);
    }
    google::
    dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize(&local_b8.
              super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_,0x4098);
    local_100 = (long *)local_b8.
                        super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        .ht_.num_buckets;
    iVar2 = UniqueObjectHelper<int>(2);
    local_110 = (long *)CONCAT44(local_110._4_4_,iVar2);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(&local_e8,
             &local_b8.
              super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ,(value_type *)&local_110);
    local_e8.first.super_iterator.ht._0_4_ = UniqueObjectHelper<int>(2);
    local_e8.first.super_iterator.ht._0_4_ = -(int)local_e8.first.super_iterator.ht;
    google::
    dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::erase(&local_b8.
             super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_,(key_type *)&local_e8);
    iVar2 = 2;
    while( true ) {
      iVar3 = UniqueObjectHelper<int>(iVar2);
      local_110 = (long *)CONCAT44(local_110._4_4_,iVar3);
      google::
      BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(&local_e8,
               &local_b8.
                super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ,(value_type *)&local_110);
      if (local_104 <=
          (float)(local_b8.
                  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.num_elements -
                 local_b8.
                 super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.num_deleted) / (float)local_100) break;
      local_110 = (long *)local_b8.
                          super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          .ht_.num_buckets;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_e8,"bucket_count","ht.bucket_count()",
                 (unsigned_long *)&local_100,(unsigned_long *)&local_110);
      if ((char)local_e8.first.super_iterator.ht == '\0') {
        testing::Message::Message((Message *)&local_110);
        pcVar4 = "";
        if (local_e8.first.super_iterator.pos != (pointer)0x0) {
          pcVar4 = *(char **)local_e8.first.super_iterator.pos;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x275,pcVar4);
        testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_110);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        if (local_110 != (long *)0x0) {
          (**(code **)(*local_110 + 8))();
        }
      }
      piVar1 = local_e8.first.super_iterator.pos;
      if (local_e8.first.super_iterator.pos != (pointer)0x0) {
        if (*(pointer *)local_e8.first.super_iterator.pos != local_e8.first.super_iterator.pos + 4)
        {
          operator_delete(*(pointer *)local_e8.first.super_iterator.pos);
        }
        operator_delete(piVar1);
      }
      iVar2 = iVar2 + 1;
    }
    local_110 = (long *)local_b8.
                        super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        .ht_.num_buckets;
    testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
              ((internal *)&local_e8,"ht.bucket_count()","bucket_count",(unsigned_long *)&local_110,
               (unsigned_long *)&local_100);
    if ((char)local_e8.first.super_iterator.ht == '\0') {
      testing::Message::Message((Message *)&local_110);
      pcVar4 = "";
      if (local_e8.first.super_iterator.pos != (pointer)0x0) {
        pcVar4 = *(char **)local_e8.first.super_iterator.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x277,pcVar4);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      if (local_110 != (long *)0x0) {
        (**(code **)(*local_110 + 8))();
      }
    }
    piVar1 = local_e8.first.super_iterator.pos;
    if (local_e8.first.super_iterator.pos != (pointer)0x0) {
      if (*(pointer *)local_e8.first.super_iterator.pos != local_e8.first.super_iterator.pos + 4) {
        operator_delete(*(pointer *)local_e8.first.super_iterator.pos);
      }
      operator_delete(piVar1);
    }
    fVar5 = (float)local_b8.
                   super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.num_buckets;
    local_bc = (float)(local_b8.
                       super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       .ht_.num_elements -
                      local_b8.
                      super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      .ht_.num_deleted) / fVar5 + -0.01;
    local_b8.
    super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_ = 0.5;
    if (local_bc <= 0.5) {
      local_b8.
      super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_ =
           local_bc;
    }
    local_b8.
    super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_factor_ = 1.0;
    local_b8.
    super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_threshold_ =
         (long)(fVar5 - 9.223372e+18) & (long)fVar5 >> 0x3f | (long)fVar5;
    local_b8.
    super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_threshold_ =
         (size_type)
         (local_b8.
          super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_ *
         fVar5);
    local_b8.
    super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_threshold_ =
         (long)(local_b8.
                super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                shrink_factor_ * fVar5 - 9.223372e+18) &
         (long)local_b8.
               super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
               shrink_threshold_ >> 0x3f |
         local_b8.
         super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_threshold_;
    local_b8.
    super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.consider_shrink_ =
         false;
    local_110 = (long *)&DAT_3ff0000000000000;
    local_f0.data_._0_4_ = 0x3f800000;
    testing::internal::CmpHelperEQ<double,float>
              ((internal *)&local_e8,"1.0","ht.max_load_factor()",(double *)&local_110,
               (float *)&local_f0);
    if ((char)local_e8.first.super_iterator.ht == '\0') {
      testing::Message::Message((Message *)&local_110);
      pcVar4 = "";
      if (local_e8.first.super_iterator.pos != (pointer)0x0) {
        pcVar4 = *(char **)local_e8.first.super_iterator.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x282,pcVar4);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      if (local_110 != (long *)0x0) {
        (**(code **)(*local_110 + 8))();
      }
    }
    piVar1 = local_e8.first.super_iterator.pos;
    if (local_e8.first.super_iterator.pos != (pointer)0x0) {
      if (*(pointer *)local_e8.first.super_iterator.pos != local_e8.first.super_iterator.pos + 4) {
        operator_delete(*(pointer *)local_e8.first.super_iterator.pos);
      }
      operator_delete(piVar1);
    }
    local_110 = (long *)CONCAT44(local_110._4_4_,
                                 local_b8.
                                 super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                 .ht_.settings.
                                 super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                                 shrink_factor_);
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_e8,"shrink_threshold","ht.min_load_factor()",&local_bc,
               (float *)&local_110);
    if ((char)local_e8.first.super_iterator.ht == '\0') {
      testing::Message::Message((Message *)&local_110);
      pcVar4 = "";
      if (local_e8.first.super_iterator.pos != (pointer)0x0) {
        pcVar4 = *(char **)local_e8.first.super_iterator.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x283,pcVar4);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      if (local_110 != (long *)0x0) {
        (**(code **)(*local_110 + 8))();
      }
    }
    piVar1 = local_e8.first.super_iterator.pos;
    if (local_e8.first.super_iterator.pos != (pointer)0x0) {
      if (*(pointer *)local_e8.first.super_iterator.pos != local_e8.first.super_iterator.pos + 4) {
        operator_delete(*(pointer *)local_e8.first.super_iterator.pos);
      }
      operator_delete(piVar1);
    }
    local_100 = (long *)local_b8.
                        super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        .ht_.num_buckets;
    iVar2 = 2;
    while( true ) {
      local_e8.first.super_iterator.ht._0_4_ = UniqueObjectHelper<int>(iVar2);
      local_e8.first.super_iterator.ht._0_4_ = -(int)local_e8.first.super_iterator.ht;
      google::
      dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::erase(&local_b8.
               super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_,(key_type *)&local_e8);
      iVar2 = iVar2 + 1;
      local_e8.first.super_iterator.ht._0_4_ = UniqueObjectHelper<int>(iVar2);
      local_e8.first.super_iterator.ht._0_4_ = -(int)local_e8.first.super_iterator.ht;
      google::
      dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::erase(&local_b8.
               super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_,(key_type *)&local_e8);
      iVar3 = UniqueObjectHelper<int>(iVar2);
      local_110 = (long *)CONCAT44(local_110._4_4_,iVar3);
      google::
      BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(&local_e8,
               &local_b8.
                super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ,(value_type *)&local_110);
      if ((float)(local_b8.
                  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.num_elements -
                 local_b8.
                 super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.num_deleted) / (float)local_100 <= local_bc) break;
      local_110 = (long *)local_b8.
                          super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          .ht_.num_buckets;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_e8,"bucket_count","ht.bucket_count()",
                 (unsigned_long *)&local_100,(unsigned_long *)&local_110);
      if ((char)local_e8.first.super_iterator.ht == '\0') {
        testing::Message::Message((Message *)&local_110);
        pcVar4 = "";
        if (local_e8.first.super_iterator.pos != (pointer)0x0) {
          pcVar4 = *(char **)local_e8.first.super_iterator.pos;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x28e,pcVar4);
        testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_110);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        if (local_110 != (long *)0x0) {
          (**(code **)(*local_110 + 8))();
        }
      }
      piVar1 = local_e8.first.super_iterator.pos;
      if (local_e8.first.super_iterator.pos != (pointer)0x0) {
        if (*(pointer *)local_e8.first.super_iterator.pos != local_e8.first.super_iterator.pos + 4)
        {
          operator_delete(*(pointer *)local_e8.first.super_iterator.pos);
        }
        operator_delete(piVar1);
      }
    }
    local_110 = (long *)local_b8.
                        super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        .ht_.num_buckets;
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)&local_e8,"ht.bucket_count()","bucket_count",(unsigned_long *)&local_110,
               (unsigned_long *)&local_100);
    if ((char)local_e8.first.super_iterator.ht == '\0') {
      testing::Message::Message((Message *)&local_110);
      pcVar4 = "";
      if (local_e8.first.super_iterator.pos != (pointer)0x0) {
        pcVar4 = *(char **)local_e8.first.super_iterator.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x290,pcVar4);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      if (local_110 != (long *)0x0) {
        (**(code **)(*local_110 + 8))();
      }
    }
    piVar1 = local_e8.first.super_iterator.pos;
    if (local_e8.first.super_iterator.pos != (pointer)0x0) {
      if (*(pointer *)local_e8.first.super_iterator.pos != local_e8.first.super_iterator.pos + 4) {
        operator_delete(*(pointer *)local_e8.first.super_iterator.pos);
      }
      operator_delete(piVar1);
    }
    local_b8.
    super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c16888;
    if (local_b8.
        super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        .ht_.table != (pointer)0x0) {
      free(local_b8.
           super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.table);
    }
    local_104 = local_104 + 0.2;
  } while (local_104 <= 0.8);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, LoadFactor) {
  const typename TypeParam::size_type kSize = 16536;
  // Check growing past various thresholds and then shrinking below
  // them.
  for (float grow_threshold = 0.2f; grow_threshold <= 0.8f;
       grow_threshold += 0.2f) {
    TypeParam ht;
    ht.set_deleted_key(this->UniqueKey(1));
    ht.max_load_factor(grow_threshold);
    ht.min_load_factor(0.0);
    EXPECT_EQ(grow_threshold, ht.max_load_factor());
    EXPECT_EQ(0.0, ht.min_load_factor());

    ht.resize(kSize);
    size_t bucket_count = ht.bucket_count();
    // Erase and insert an element to set consider_shrink = true,
    // which should not cause a shrink because the threshold is 0.0.
    ht.insert(this->UniqueObject(2));
    ht.erase(this->UniqueKey(2));
    for (int i = 2;; ++i) {
      ht.insert(this->UniqueObject(i));
      if (static_cast<float>(ht.size()) / bucket_count < grow_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_GT(ht.bucket_count(), bucket_count);
        break;
      }
    }
    // Now set a shrink threshold 1% below the current size and remove
    // items until the size falls below that.
    const float shrink_threshold =
        static_cast<float>(ht.size()) / ht.bucket_count() - 0.01f;

    // This time around, check the old set_resizing_parameters interface.
    ht.set_resizing_parameters(shrink_threshold, 1.0);
    EXPECT_EQ(1.0, ht.max_load_factor());
    EXPECT_EQ(shrink_threshold, ht.min_load_factor());

    bucket_count = ht.bucket_count();
    for (int i = 2;; ++i) {
      ht.erase(this->UniqueKey(i));
      // A resize is only triggered by an insert, so add and remove a
      // value every iteration to trigger the shrink as soon as the
      // threshold is passed.
      ht.erase(this->UniqueKey(i + 1));
      ht.insert(this->UniqueObject(i + 1));
      if (static_cast<float>(ht.size()) / bucket_count > shrink_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_LT(ht.bucket_count(), bucket_count);
        break;
      }
    }
  }
}